

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O0

ssize_t __thiscall Amiga::Chipset::read(Chipset *this,int __fd,void *__buf,size_t __nbytes)

{
  uint16_t uVar1;
  uint uVar2;
  ulong uVar3;
  undefined6 uVar4;
  undefined6 extraout_var;
  Joystick *this_00;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  ushort uVar5;
  LogLine local_48 [3];
  LogLine local_30 [2];
  byte local_1d;
  uint16_t result;
  uint16_t position_1;
  uint16_t position;
  bool allow_conversion_local;
  uint32_t address_local;
  Chipset *this_local;
  
  local_1d = (byte)__buf & 1;
  uVar2 = __fd & 0x1fe;
  uVar3 = (ulong)(uVar2 - 0x1e);
  _result = __fd;
  _position = this;
  if (uVar2 - 2 < 0x1c || uVar2 - 0x1e == 0) {
    uVar3 = (long)&switchD_0040fd66::switchdataD_00a317ec +
            (long)(int)(&switchD_0040fd66::switchdataD_00a317ec)[uVar2 - 2];
    uVar4 = (undefined6)((ulong)this >> 0x10);
    switch(uVar2) {
    case 0:
      uVar5 = this->dma_control_;
      uVar1 = Blitter<false>::get_status(&this->blitter_);
      this_local._6_2_ = uVar5 | uVar1;
      uVar3 = 0;
      break;
    case 2:
      uVar5 = 0;
      if ((this->is_long_field_ & 1U) != 0) {
        uVar5 = 0x8000;
      }
      this_local._6_2_ = (ushort)((uint)this->y_ >> 8) | uVar5;
      uVar3 = 0;
      break;
    case 4:
      this_local._6_2_ = (ushort)(this->line_cycle_ >> 1) & 0xff | (ushort)(this->y_ << 8);
      uVar3 = (ulong)CONCAT22((short)((uint)this->y_ >> 8),this_local._6_2_);
      break;
    default:
      goto switchD_0040fd66_caseD_8;
    case 8:
      this_local._6_2_ = Mouse::get_position(&this->mouse_);
      uVar3 = CONCAT62(extraout_var,this_local._6_2_);
      break;
    case 10:
      this_00 = joystick(this,0);
      this_local._6_2_ = Amiga::Joystick::get_position(this_00);
      uVar3 = CONCAT62(extraout_var_00,this_local._6_2_);
      break;
    case 0xc:
      this_local._6_2_ = this->collisions_;
      this->collisions_ = 0;
      uVar3 = CONCAT62(uVar4,this_local._6_2_);
      break;
    case 0xe:
      Log::Logger<(Log::Source)5>::info((Logger<(Log::Source)5> *)local_30);
      Log::Logger<(Log::Source)5>::LogLine::append(local_30,"Read disk control");
      Log::Logger<(Log::Source)5>::LogLine::~LogLine(local_30);
      this_local._6_2_ = this->paula_disk_control_;
      uVar3 = CONCAT62(uVar4,this_local._6_2_);
      break;
    case 0x14:
      this_local._6_2_ = 0xff00;
      break;
    case 0x16:
      this_local._6_2_ = SerialPort::get_status((SerialPort *)&this->field_0x6640);
      uVar3 = CONCAT62(extraout_var_01,this_local._6_2_);
      break;
    case 0x18:
      Log::Logger<(Log::Source)5>::error((Logger<(Log::Source)5> *)local_48);
      Log::Logger<(Log::Source)5>::LogLine::append(local_48,"TODO: disk status");
      Log::Logger<(Log::Source)5>::LogLine::~LogLine(local_48);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Chipset.cpp"
                    ,0x483,"uint16_t Amiga::Chipset::read(uint32_t, bool)");
    case 0x1a:
      this_local._6_2_ = this->interrupt_enable_;
      uVar3 = CONCAT62(uVar4,this_local._6_2_);
      break;
    case 0x1c:
      this_local._6_2_ = this->interrupt_requests_;
      uVar3 = CONCAT62(uVar4,this_local._6_2_);
    }
  }
  else {
switchD_0040fd66_caseD_8:
    if (((ulong)__buf & 1) != 0) {
      uVar3 = write(this,__fd,(void *)0xffff,0);
    }
    this_local._6_2_ = 0xffff;
  }
  return CONCAT62((int6)(uVar3 >> 0x10),this_local._6_2_);
}

Assistant:

uint16_t Chipset::read(uint32_t address, bool allow_conversion) {
	switch(address & ChipsetAddressMask) {
		default:
			// If there was nothing to read, perform a write.
			// TODO: Rather than 0xffff, should be whatever is left on the bus, vapour-lock style.
			if(allow_conversion) write(address, 0xffff, false);
		return 0xffff;

		// Raster position.
		case 0x004: {		// VPOSR; b15 = LOF, b0 = b8 of y position.
			const uint16_t position = uint16_t(y_ >> 8);
			return
				position |
				(is_long_field_ ? 0x8000 : 0x0000);

			// b8–b14 should be:
			//	00 for PAL Agnus or fat Agnus
			//	10 for NTSC Agnus or fat Agnus
			//	20 for PAL high-res
			//	30 for NTSC high-res
		}
		case 0x006: {		// VHPOSR; b0–b7 = horizontal; b8–b15 = low bits of vertical position.
			const uint16_t position = uint16_t(((line_cycle_ >> 1) & 0x00ff) | (y_ << 8));
			return position;
		}

		case 0x00e: {		// CLXDAT
			const uint16_t result = collisions_;
			collisions_ = 0;
			return result;
		};

		// Joystick/mouse input.
		case 0x00a:	return mouse_.get_position();			// JOY0DAT
		case 0x00c:	return joystick(0).get_position();		// JOY1DAT

		case 0x016:		// POTGOR / POTINP
//			logger.error().append("TODO: pot port read");
		return 0xff00;

		// Disk DMA and control.
		case 0x010:		// ADKCONR
			logger.info().append("Read disk control");
		return paula_disk_control_;
		case 0x01a:		// DSKBYTR
			logger.error().append("TODO: disk status");
			assert(false);	// Not yet implemented.
		return 0xffff;

		// Serial port.
		case 0x018:	return serial_.get_status();

		// DMA management.
		case 0x002:	return dma_control_ | blitter_.get_status();		// DMACONR

		// Interrupts.
		case 0x01c:	return interrupt_enable_;							// INTENAR
		case 0x01e:	return interrupt_requests_;							// INTREQR
	}
}